

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canal.cc
# Opt level: O3

void search<OffsetBoundSymbolMatcher,unsigned_int>
               (csptr *view,OffsetBoundSymbolMatcher *m,Addr loc,AddressRanges *searchaddrs,
               SymbolStore *store,bool showaddrs)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer ppVar3;
  uint *puVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  pair<unsigned_long,_unsigned_long> *range;
  pointer ppVar7;
  size_t sVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  undefined1 auStack_80190 [8];
  ReaderArray<unsigned_int,_131072UL> r;
  IOFlagSave _;
  
  pstack::IOFlagSave::IOFlagSave
            ((IOFlagSave *)(r.cache._M_elems + 0x1fffe),
             (ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  pstack::ReaderArray<unsigned_int,_131072UL>::ReaderArray
            ((ReaderArray<unsigned_int,_131072UL> *)auStack_80190,
             (view->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
  if ((searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    if (r.cacheEnd != 0) {
      p_Var1 = &(store->store_)._M_t._M_impl.super__Rb_tree_header;
      sVar8 = 0;
      do {
        puVar4 = pstack::ReaderArray<unsigned_int,_131072UL>::getitem
                           ((ReaderArray<unsigned_int,_131072UL> *)auStack_80190,sVar8);
        p_Var6 = (store->store_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var6 != (_Base_ptr)0x0) {
          uVar10 = (ulong)*puVar4;
          p_Var9 = &p_Var1->_M_header;
          do {
            if (*(ulong *)(p_Var6 + 1) >= uVar10) {
              p_Var9 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar10];
          } while (p_Var6 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
             (*(long *)((long)p_Var9 + 0x28 + 8) +
              *(long *)((long)p_Var9 + 0x28 + 0x18) + m->offset_ == uVar10)) {
            if (showaddrs) {
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,*(char **)((long)p_Var9 + 0x28 + 0x20),
                                  *(long *)((long)p_Var9 + 0x50));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," 0x",3);
              *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                   *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                   *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," ... size=",10);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", diff=",7);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
            }
            *(long *)((long)p_Var9 + 0x50 + 0x18) = *(long *)((long)p_Var9 + 0x50 + 0x18) + 1;
          }
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != r.cacheEnd);
    }
  }
  else if (r.cacheEnd != 0) {
    sVar8 = 0;
    do {
      puVar4 = pstack::ReaderArray<unsigned_int,_131072UL>::getitem
                         ((ReaderArray<unsigned_int,_131072UL> *)auStack_80190,sVar8);
      ppVar7 = (searchaddrs->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (searchaddrs->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar7 != ppVar3) {
        uVar2 = *puVar4;
        do {
          if ((ppVar7->first <= (ulong)uVar2) && ((ulong)uVar2 < ppVar7->second)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
            *(uint *)(pstack::Flags::add + *(long *)(std::cout + -0x18)) =
                 *(uint *)(pstack::Flags::add + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                 *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          }
          ppVar7 = ppVar7 + 1;
        } while (ppVar7 != ppVar3);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != r.cacheEnd);
  }
  pstack::IOFlagSave::~IOFlagSave((IOFlagSave *)(r.cache._M_elems + 0x1fffe));
  return;
}

Assistant:

inline void search(
        const Reader::csptr &view,
        const Matcher & m,
        Elf::Addr loc,
        const AddressRanges &searchaddrs,
        SymbolStore &store,
        bool showaddrs) {
    try {
        IOFlagSave _(cout);
        ReaderArray<Word, 131072> r(*view, 0);
        auto start = r.begin();
        if (searchaddrs.size()) {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                for (const auto &range : searchaddrs )
                    if (p >= range.first && p < range.second)
                        cout << "0x" << hex << loc + (cur - start) * sizeof( Word) << dec << "\n";
            }
        } else {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                if ( auto [ found, sym ] = store.find(p, m); found) {
                    if (showaddrs)
                        cout
                            << sym->name << " 0x" << std::hex << loc + (cur - start) * sizeof(Word)
                            << std::dec <<  " ... size=" << sym->sym.st_size
                            << ", diff=" << p - sym->memaddr() << endl;
#ifdef WITH_PYTHON
                    if (py) {
                        std::cout << "pyo " << Elf::Addr(loc) << " ";
                        py->print(Elf::Addr(loc) - sizeof (PyObject) +
                                sizeof (struct _typeobject *));
                        std::cout << "\n";
                    }
#endif
                    sym->count++;
                }
            }
        }
    } catch (const std::exception &ex) {
        std::clog << "warning: error reading data at " << std::hex << loc << std::dec << ": " << ex.what() << "\n";
    }
}